

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::ReportLeaks(Recycler *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  char *obj;
  undefined8 *in_FS_OFFSET;
  undefined1 local_570 [8];
  Param param;
  AutoHandledExceptionType __autoHandledExceptionType;
  
  bVar3 = Js::ConfigFlagsTable::IsEnabled(this->recyclerFlagsTable,LeakReportFlag);
  if (bVar3) {
    if (this->recyclerFlagsTable->ForceMemoryLeak == true) {
      AutoHandledExceptionType::AutoHandledExceptionType
                ((AutoHandledExceptionType *)((long)&param.stats.numZeroedOutSmallBlocks + 3),
                 ExceptionType_DisableCheck);
      local_570 = (undefined1  [8])&ReportLeaks()::FakeMemory::typeinfo;
      param.dumpReferenceFunc = (_func_bool_char16_ptr_void_ptr_void_ptr *)0x0;
      param.dumpRootOnly = true;
      param.skipStack = true;
      param._10_6_ = 0xffffffffffff;
      param.stats.startCollectAllocBytes = (size_t)anon_var_dwarf_1333d3;
      param.stats.startCollectNewPageCount._0_4_ = 0x21df;
      TrackAllocInfo(this,(TrackAllocData *)local_570);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00285bb7;
        *puVar1 = 0;
      }
      obj = AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>(this,4);
      if (obj == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_00285bb7:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar1 = 0;
      }
      RootAddRef(this,obj,(uint *)0x0);
      AutoHandledExceptionType::~AutoHandledExceptionType
                ((AutoHandledExceptionType *)((long)&param.stats.numZeroedOutSmallBlocks + 3));
    }
    LeakReport::StartSection(L"Object Graph");
    LeakReport::StartRedirectOutput();
    memset((Param *)local_570,0,0x548);
    param.dumpReferenceFunc._0_2_ = CONCAT11(1,param.dumpReferenceFunc._0_1_);
    bVar3 = DumpObjectGraph(this,(Param *)local_570);
    if (!bVar3) {
      LeakReport::Print(
                       L"--------------------------------------------------------------------------------\n"
                       );
      LeakReport::Print(L"ERROR: Out of memory generating leak report\n");
      param.stats.markData.rescanLargeByteCount = 0;
    }
    LeakReport::EndRedirectOutput();
    if (param.stats.markData.rescanLargeByteCount != 0) {
      LeakReport::Print(
                       L"--------------------------------------------------------------------------------\n"
                       );
      LeakReport::Print(L"Recycler Leaked Object: %d bytes (%d objects)\n",
                        param.stats.markData.markCount,param.stats.markData.rescanLargeByteCount);
      if (this->recyclerFlagsTable->LeakStackTrace == true) {
        LeakReport::StartSection(L"Pinned object stack traces");
        LeakReport::StartRedirectOutput();
        PrintPinnedObjectStackTraces(this);
        LeakReport::EndRedirectOutput();
        LeakReport::EndSection();
      }
    }
    LeakReport::EndSection();
  }
  return;
}

Assistant:

void
Recycler::ReportLeaks()
{
    if (GetRecyclerFlagsTable().IsEnabled(Js::LeakReportFlag))
    {
        if (GetRecyclerFlagsTable().ForceMemoryLeak)
        {
            AUTO_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
            struct FakeMemory { Field(int) f; };
            FakeMemory * f = RecyclerNewStruct(this, FakeMemory);
            this->RootAddRef(f);
        }

        LeakReport::StartSection(_u("Object Graph"));
        LeakReport::StartRedirectOutput();

        RecyclerObjectGraphDumper::Param param = { 0 };
        param.skipStack = true;
        if (!this->DumpObjectGraph(&param))
        {
            LeakReport::Print(_u("--------------------------------------------------------------------------------\n"));
            LeakReport::Print(_u("ERROR: Out of memory generating leak report\n"));
            param.stats.markData.markCount = 0;
        }

        LeakReport::EndRedirectOutput();

        if (param.stats.markData.markCount != 0)
        {
            LeakReport::Print(_u("--------------------------------------------------------------------------------\n"));
            LeakReport::Print(_u("Recycler Leaked Object: %d bytes (%d objects)\n"),
                param.stats.markData.markBytes, param.stats.markData.markCount);

#ifdef STACK_BACK_TRACE
            if (GetRecyclerFlagsTable().LeakStackTrace)
            {
                LeakReport::StartSection(_u("Pinned object stack traces"));
                LeakReport::StartRedirectOutput();
                this->PrintPinnedObjectStackTraces();
                LeakReport::EndRedirectOutput();
                LeakReport::EndSection();
            }
#endif
        }
        LeakReport::EndSection();
    }
}